

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  StructurePatternSyntax *pSVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *in_stack_00000110;
  
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  deepClone<slang::syntax::StructurePatternMemberSyntax>(in_stack_00000110,in_stack_00000108);
  TVar3 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::StructurePatternSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      (Token *)TVar3.info);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const StructurePatternSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<StructurePatternSyntax>(
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc)
    );
}